

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_array.c
# Opt level: O0

void garray_save(t_gobj *z,_binbuf *b)

{
  _array *p_Var1;
  t_symbol *ptVar2;
  t_template *x_00;
  t_symbol *ptVar3;
  t_float tVar4;
  int local_50;
  int local_4c;
  t_template *scalartemplate;
  _array *array;
  _garray *x;
  int filestyle;
  int style;
  _binbuf *b_local;
  t_gobj *z_local;
  
  p_Var1 = garray_getarray((_garray *)z);
  ptVar3 = (z[1].g_pd)->c_externdir;
  ptVar2 = gensym("pd-float-array");
  if (ptVar3 == ptVar2) {
    x_00 = template_findbyname((z[1].g_pd)->c_externdir);
    if (x_00 == (t_template *)0x0) {
      pd_error((void *)0x0,"array: no template of type %s",(z[1].g_pd)->c_externdir->s_name);
    }
    else {
      ptVar3 = gensym("style");
      tVar4 = template_getfloat(x_00,ptVar3,(t_word *)&(z[1].g_pd)->c_size,0);
      local_50 = (int)tVar4;
      if (local_50 == 0) {
        local_4c = 1;
      }
      else {
        if (local_50 == 1) {
          local_50 = 0;
        }
        local_4c = local_50;
      }
      ptVar3 = gensym("#X");
      ptVar2 = gensym("array");
      binbuf_addv(b,"sssisi;",ptVar3,ptVar2,z[2].g_pd,(ulong)(uint)p_Var1->a_n,&s_float,
                  (uint)(*(byte *)&z[3].g_pd >> 1 & 1) + local_4c * 2 +
                  (uint)(*(byte *)&z[3].g_pd >> 4 & 1) * 8);
      garray_savecontentsto((_garray *)z,b);
    }
  }
  else {
    pd_error(z,"can\'t save arrays of type %s yet",(z[1].g_pd)->c_externdir->s_name);
  }
  return;
}

Assistant:

static void garray_save(t_gobj *z, t_binbuf *b)
{
    int style, filestyle;
    t_garray *x = (t_garray *)z;
    t_array *array = garray_getarray(x);
    t_template *scalartemplate;
    if (x->x_scalar->sc_template != gensym("pd-float-array"))
    {
            /* LATER "save" the scalar as such */
        pd_error(x, "can't save arrays of type %s yet",
            x->x_scalar->sc_template->s_name);
        return;
    }
    if (!(scalartemplate = template_findbyname(x->x_scalar->sc_template)))
    {
        pd_error(0, "array: no template of type %s",
            x->x_scalar->sc_template->s_name);
        return;
    }
    style = template_getfloat(scalartemplate, gensym("style"),
            x->x_scalar->sc_vec, 0);
    filestyle = (style == PLOTSTYLE_POINTS ? 1 :
        (style == PLOTSTYLE_POLY ? 0 : style));
    binbuf_addv(b, "sssisi;", gensym("#X"), gensym("array"),
        x->x_name, array->a_n, &s_float,
            x->x_saveit + 2 * filestyle + 8*x->x_hidename);
    garray_savecontentsto(x, b);
}